

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

CodeDescriptor * __thiscall
FastVector<BinaryCache::CodeDescriptor,_false,_false>::push_back
          (FastVector<BinaryCache::CodeDescriptor,_false,_false> *this)

{
  uint uVar1;
  CodeDescriptor *pCVar2;
  
  if (this->count == this->max) {
    pCVar2 = this->data;
    grow_no_destroy(this,this->count);
    if (pCVar2 != (CodeDescriptor *)0x0) {
      (*(code *)NULLC::dealloc)(pCVar2);
    }
  }
  uVar1 = this->count;
  this->count = uVar1 + 1;
  return this->data + uVar1;
}

Assistant:

T* push_back()
	{
		if(count == max)
			grow(count);

		count++;

		return &data[count - 1];
	}